

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O3

int ft_black_new(FT_Memory memory,black_PRaster *araster)

{
  black_PRaster pbVar1;
  FT_Error error;
  int local_1c;
  
  *araster = (black_PRaster)0x0;
  pbVar1 = (black_PRaster)ft_mem_alloc(memory,8,&local_1c);
  if (local_1c == 0) {
    pbVar1->memory = memory;
    *araster = pbVar1;
  }
  return local_1c;
}

Assistant:

static int
  ft_black_new( FT_Memory       memory,
                black_PRaster  *araster )
  {
    FT_Error       error;
    black_PRaster  raster = NULL;


    *araster = 0;
    if ( !FT_NEW( raster ) )
    {
      raster->memory = memory;
      ft_black_init( raster );

      *araster = raster;
    }

    return error;
  }